

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::merge
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *src,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  field_type fVar5;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar6;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar7;
  template_ElementType<1UL> *ptVar8;
  template_ElementType<3UL> *ppbVar9;
  ulong uVar10;
  template_ElementType<2UL> *local_38;
  
  pbVar6 = parent(this);
  pbVar7 = parent(src);
  if (pbVar6 != pbVar7) {
    __assert_fail("parent() == src->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x923,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(src);
  if (bVar1 + 1 == (uint)bVar2) {
    bVar1 = count(this);
    pbVar6 = parent(this);
    bVar2 = position(this);
    local_38 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                *)pbVar6);
    local_38 = local_38 + bVar2;
    btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
    value_init<int*>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                      *)this,(ulong)bVar1,alloc,&local_38);
    bVar1 = count(src);
    bVar2 = count(this);
    uninitialized_move_n(src,(ulong)bVar1,0,(ulong)bVar2 + 1,this,alloc);
    bVar1 = count(src);
    value_destroy_n(src,0,(ulong)bVar1,alloc);
    bVar3 = leaf(this);
    if (!bVar3) {
      uVar10 = 0;
      while( true ) {
        bVar1 = count(src);
        if (bVar1 < uVar10) break;
        bVar1 = count(this);
        ppbVar9 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                  ::GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                   *)src);
        init_child(this,(int)uVar10 + (uint)bVar1 + 1,ppbVar9[uVar10]);
        btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
        GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                       *)src);
        uVar10 = uVar10 + 1;
      }
    }
    fVar4 = count(this);
    fVar5 = count(src);
    ptVar8 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)this);
    ptVar8[2] = fVar5 + fVar4 + '\x01';
    ptVar8 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)src);
    ptVar8[2] = '\0';
    pbVar6 = parent(this);
    bVar1 = position(this);
    remove_value(pbVar6,(uint)bVar1,alloc);
    return;
  }
  __assert_fail("position() + 1 == src->position()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x924,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::merge(btree_node *src, allocator_type *alloc) {
        assert(parent() == src->parent());
        assert(position() + 1 == src->position());

        // Move the delimiting value to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // Move the values from the right to the left node.
        src->uninitialized_move_n(src->count(), 0, count() + 1, this, alloc);

        // Destroy the now-empty entries in the right node.
        src->value_destroy_n(0, src->count(), alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i <= src->count(); ++i) {
                init_child(count() + i + 1, src->child(i));
                src->clear_child(i);
            }
        }

        // Fixup the counts on the src and dest nodes.
        set_count((field_type)(1 + count() + src->count()));
        src->set_count(0);

        // Remove the value on the parent node.
        parent()->remove_value(position(), alloc);
    }